

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall mario::EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->_pendingFunctors,cb);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  iVar1 = this->_threadId;
  iVar2 = *(int *)(in_FS_OFFSET + -8);
  if (iVar2 == 0) {
    CurrentThread::cacheTid();
    iVar2 = *(int *)(in_FS_OFFSET + -8);
  }
  if ((iVar1 == iVar2) && (this->_callingPendingFunctors != true)) {
    return;
  }
  wakeup(this);
  return;
}

Assistant:

void EventLoop::queueInLoop(const Functor& cb) {
    {
        MutexLockGuard lock(_mutex);
        _pendingFunctors.push_back(cb);
    }

    if (!isInLoopThread() || _callingPendingFunctors) {
        wakeup();
    }
}